

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O3

void __thiscall KktChStep::resizeProblemMatrix(KktChStep *this,KktCheck *checker)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  size_type sVar19;
  size_type sVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  vector<int,_std::allocator<int>_> iwork;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  vector<int,_std::allocator<int>_> nzRow;
  allocator_type local_b5;
  value_type local_b4;
  KktChStep *local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  ulong local_60;
  long local_58;
  pointer local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->RnumRow,(value_type *)&local_78,(allocator_type *)&local_90);
  iVar21 = this->RnumRow;
  sVar19 = (size_type)iVar21;
  if (0 < (long)sVar19) {
    piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    sVar20 = sVar19;
    do {
      if (piVar4[lVar18] != 0) {
        lVar15 = (long)piVar5[lVar18];
        iVar21 = piVar5[lVar18 + 1];
        if (piVar5[lVar18] < iVar21) {
          do {
            if (piVar7[piVar6[lVar15]] != 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar18] =
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18] + 1;
              iVar21 = piVar5[lVar18 + 1];
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar21);
          sVar20 = (size_type)(uint)this->RnumRow;
        }
      }
      lVar18 = lVar18 + 1;
      iVar21 = (int)sVar20;
      sVar19 = (size_type)iVar21;
    } while (lVar18 < (long)sVar19);
  }
  this->numRow = iVar21;
  this->numCol = this->RnumCol;
  local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,sVar19,(value_type *)&local_90,(allocator_type *)&local_a8);
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_90,(long)this->numCol,(value_type *)&local_a8,(allocator_type *)&local_b4);
  iVar21 = this->numRow;
  iVar14 = 0;
  if (iVar21 < 1) {
    iVar23 = 0;
    sVar19 = 0;
  }
  else {
    piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    iVar17 = 0;
    iVar23 = 0;
    do {
      if (piVar4[lVar18] != 0) {
        iVar17 = iVar17 + local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18];
        *(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar18 * 4) = iVar23;
        iVar23 = iVar23 + 1;
        iVar21 = this->numRow;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar21);
    sVar19 = (size_type)iVar17;
  }
  iVar21 = this->numCol;
  if (0 < iVar21) {
    piVar4 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    iVar14 = 0;
    do {
      if (piVar4[lVar18] != 0) {
        *(int *)(CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar18 * 4) = iVar14;
        iVar14 = iVar14 + 1;
        iVar21 = this->numCol;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar21);
  }
  KktCheck::setIndexVectors(checker,&local_78,&local_90);
  uVar2 = this->numCol;
  uVar3 = this->numRow;
  uVar22 = (ulong)uVar3;
  this->numRow = iVar23;
  this->numCol = iVar14;
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,(long)iVar14,&local_b4,&local_b5);
  this_00 = &this->Astart;
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numCol + 1,&local_b4);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,sVar19);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,sVar19);
  if (0 < (int)uVar3) {
    piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      if (piVar4[uVar16] != 0) {
        lVar18 = (long)piVar5[uVar16];
        iVar21 = piVar5[uVar16 + 1];
        if (piVar5[uVar16] < iVar21) {
          do {
            lVar15 = (long)piVar6[lVar18];
            if (piVar7[lVar15] != 0) {
              piVar1 = (int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) +
                              (long)*(int *)(CONCAT44(local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                            lVar15 * 4) * 4);
              *piVar1 = *piVar1 + 1;
              iVar21 = piVar5[uVar16 + 1];
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < iVar21);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar22);
  }
  iVar21 = this->numCol;
  if (0 < iVar21) {
    piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = *piVar1;
    lVar18 = 0;
    do {
      iVar14 = iVar14 + *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                lVar18 * 4);
      piVar1[lVar18 + 1] = iVar14;
      iVar21 = this->numCol;
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar21);
    if (0 < iVar21) {
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar18 * 4) = piVar4[lVar18];
        lVar18 = lVar18 + 1;
        iVar21 = this->numCol;
      } while (lVar18 < iVar21);
    }
  }
  if (0 < (int)uVar3) {
    local_50 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_58 = CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_);
    piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      if (local_50[uVar16] != 0) {
        lVar18 = (long)piVar4[uVar16];
        iVar21 = piVar4[uVar16 + 1];
        if (piVar4[uVar16] < iVar21) {
          iVar14 = *(int *)(local_58 + uVar16 * 4);
          pdVar8 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            lVar15 = (long)piVar5[lVar18];
            if (piVar6[lVar15] != 0) {
              lVar15 = (long)*(int *)(CONCAT44(local_90.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               local_90.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_) + lVar15 * 4
                                     );
              iVar21 = *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               lVar15 * 4);
              *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar15 * 4) = iVar21 + 1;
              piVar7[iVar21] = iVar14;
              pdVar9[iVar21] = pdVar8[lVar18];
              iVar21 = piVar4[uVar16 + 1];
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < iVar21);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar22);
    iVar21 = this->numCol;
    local_b0 = this;
    local_60 = (ulong)uVar2;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->colCost,(long)iVar21);
  std::vector<double,_std::allocator<double>_>::resize(&this->colLower,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,(long)this->numCol);
  if (0 < (int)uVar2) {
    piVar4 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar16 = 0;
    iVar21 = 0;
    do {
      if (piVar4[uVar16] != 0) {
        pdVar10[iVar21] = pdVar8[uVar16];
        pdVar11[iVar21] = pdVar9[uVar16];
        pdVar13[iVar21] = pdVar12[uVar16];
        iVar21 = iVar21 + 1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar2 != uVar16);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,(long)this->numRow);
  if (0 < (int)uVar3) {
    piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar16 = 0;
    iVar21 = 0;
    do {
      if (piVar4[uVar16] != 0) {
        pdVar10[iVar21] = pdVar9[uVar16];
        pdVar11[iVar21] = pdVar8[uVar16];
        iVar21 = iVar21 + 1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  if ((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KktChStep::resizeProblemMatrix(KktCheck& checker) {
	//full matrix data in AR copy, A copy made to be passed to checker
	int i, j, k;
	int nz = 0;
	int nR = 0;
	int nC = 0;
	
	//nzRow is the current # on nonzeros, not the general one! 
	vector<int> nzRow(RnumRow, 0);
	for (i=0;i<RnumRow;i++) 
		if (flagRow[i])
			for (k=ARstart[i]; k<ARstart[i+1]; k++) 
				if (flagCol[ARindex[k]]) 
					nzRow[i]++;
	
	numRow = RnumRow;
	numCol = RnumCol;
	//arrays to keep track of indices
	vector<int> rIndex(numRow, -1);
	vector<int> cIndex(numCol, -1);
		 
	for (i=0;i<numRow;i++)
		if (flagRow[i]) {
			nz += nzRow[i];
			rIndex[i] = nR;
			nR++;
			}
			
	for (i=0;i<numCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}

	//set indices for checker
	checker.setIndexVectors(rIndex, cIndex);
		
	//counts		
	int numRowEq = numRow;
	int numColEq = numCol;
	numRow = nR;
	numCol = nC;
	
	//matrix
    vector<int> iwork(numCol, 0);
    Astart.resize(numCol + 1, 0);
    Aindex.resize(nz);
    Avalue.resize(nz);
    
        
    for (i = 0;i<numRowEq; i++) 
    	if (flagRow[i])
    	    for (int k = ARstart[i]; k < ARstart[i+1]; k++) {
    	    	j = ARindex[k];
    	    	if (flagCol[j])
        			iwork[cIndex[j]]++;
        		}     
    for (i = 1; i <= numCol; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numCol; i++)
        iwork[i] = Astart[i];
    for (i = 0; i < numRowEq; i++) {
    	if (flagRow[i]) {
			int iRow = rIndex[i];
		    for (k = ARstart[i]; k < ARstart[i + 1]; k++) {
		        j = ARindex[k];
		        if (flagCol[j]) {
		        	int iCol = cIndex[j];
				    int iPut = iwork[iCol]++;
				    Aindex[iPut] = iRow;
				    Avalue[iPut] = ARvalue[k];
				}
		    }
		}
    }
	
	//resize cost, RHS, bounds    
    colCost.resize(numCol);
    colLower.resize(numCol);
    colUpper.resize(numCol);
    
    k=0;
    for (i=0;i<numColEq;i++) 
    	if (flagCol[i]) {
    		colCost[k]  = RcolCost[i];
    		colLower[k] = RcolLower[i];
    		colUpper[k] = RcolUpper[i];
    		k++;
	    }
    
    rowLower.resize(numRow);
    rowUpper.resize(numRow);

    k=0;
    for (i=0;i<numRowEq;i++) 
    	if (flagRow[i]) {
    		rowUpper[k] = RrowUpper[i];
    		rowLower[k] = RrowLower[i];

    		//b[k] = Rb[i];
    		k++;
	    }
	
	
		
}